

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O0

void __thiscall
yactfr::FixedLengthBitMapType::FixedLengthBitMapType
          (FixedLengthBitMapType *this,uint align,uint len,ByteOrder bo,Flags *flags,
          optional<yactfr::BitOrder> *bio,Up *attrs)

{
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  optional<yactfr::BitOrder> *local_30;
  optional<yactfr::BitOrder> *bio_local;
  Flags *flags_local;
  uint local_18;
  ByteOrder bo_local;
  uint len_local;
  uint align_local;
  FixedLengthBitMapType *this_local;
  
  local_30 = bio;
  bio_local = (optional<yactfr::BitOrder> *)flags;
  flags_local._4_4_ = bo;
  local_18 = len;
  bo_local = align;
  _len_local = this;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_38,attrs);
  FixedLengthBitArrayType::FixedLengthBitArrayType
            (&this->super_FixedLengthBitArrayType,_kindFlBitMap,align,len,bo,bio,&local_38);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_38);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__FixedLengthBitMapType_007e5a68;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
  ::map(&this->_flags,flags);
  _flagMasksFromFlags(&this->_flagMasks,&this->_flags);
  return;
}

Assistant:

FixedLengthBitMapType::FixedLengthBitMapType(const unsigned int align, const unsigned int len,
                                             const ByteOrder bo, Flags flags,
                                             const boost::optional<BitOrder>& bio,
                                             MapItem::Up attrs) :
    FixedLengthBitArrayType {_kindFlBitMap, align, len, bo, bio, std::move(attrs)},
    _flags {std::move(flags)},
    _flagMasks {this->_flagMasksFromFlags(_flags)}
{
}